

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                (ImGuiDataType data_type,unsigned_long_long v,unsigned_long_long v_min,
                unsigned_long_long v_max,bool is_logarithmic,float logarithmic_zero_epsilon,
                float zero_deadzone_halfsize)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar15;
  float local_12c;
  float local_110;
  float local_108;
  float local_ec;
  float local_e4;
  float local_d4;
  float local_cc;
  float local_c4;
  float local_bc;
  float local_b4;
  float local_ac;
  float local_a4;
  double local_a0;
  float local_94;
  float local_8c;
  double local_88;
  float local_7c;
  float local_74;
  unsigned_long_long local_70;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float result;
  double v_max_fudged;
  double v_min_fudged;
  bool flipped;
  unsigned_long_long v_clamped;
  float zero_deadzone_halfsize_local;
  float logarithmic_zero_epsilon_local;
  bool is_logarithmic_local;
  unsigned_long_long v_max_local;
  unsigned_long_long v_min_local;
  unsigned_long_long v_local;
  ImGuiDataType data_type_local;
  undefined1 auVar14 [16];
  
  if (v_min == v_max) {
    v_local._4_4_ = 0.0;
  }
  else {
    _logarithmic_zero_epsilon_local = v_max;
    v_max_local = v_min;
    v_min_local = v;
    v_local._0_4_ = data_type;
    if (v_min < v_max) {
      local_70 = ImClamp<unsigned_long_long>(v,v_min,v_max);
    }
    else {
      local_70 = ImClamp<unsigned_long_long>(v,v_max,v_min);
    }
    if (is_logarithmic) {
      bVar1 = _logarithmic_zero_epsilon_local < v_max_local;
      if (bVar1) {
        ImSwap<unsigned_long_long>
                  (&v_max_local,(unsigned_long_long *)&logarithmic_zero_epsilon_local);
      }
      auVar4._8_4_ = (int)(v_max_local >> 0x20);
      auVar4._0_8_ = v_max_local;
      auVar4._12_4_ = 0x45300000;
      dVar2 = ImAbs((auVar4._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)v_max_local) - 4503599627370496.0));
      if ((double)logarithmic_zero_epsilon <= dVar2) {
        auVar5._8_4_ = (int)(v_max_local >> 0x20);
        auVar5._0_8_ = v_max_local;
        auVar5._12_4_ = 0x45300000;
        local_88 = (auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)v_max_local) - 4503599627370496.0);
      }
      else {
        local_74 = (float)v_max_local;
        local_7c = logarithmic_zero_epsilon;
        if (local_74 < 0.0) {
          local_7c = -logarithmic_zero_epsilon;
        }
        local_88 = (double)local_7c;
      }
      v_max_fudged = local_88;
      auVar6._8_4_ = (int)(_logarithmic_zero_epsilon_local >> 0x20);
      auVar6._0_8_ = _logarithmic_zero_epsilon_local;
      auVar6._12_4_ = 0x45300000;
      dVar2 = ImAbs((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)_logarithmic_zero_epsilon_local) -
                    4503599627370496.0));
      if ((double)logarithmic_zero_epsilon <= dVar2) {
        auVar7._8_4_ = (int)(_logarithmic_zero_epsilon_local >> 0x20);
        auVar7._0_8_ = _logarithmic_zero_epsilon_local;
        auVar7._12_4_ = 0x45300000;
        local_a0 = (auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)_logarithmic_zero_epsilon_local) -
                   4503599627370496.0);
      }
      else {
        local_8c = (float)_logarithmic_zero_epsilon_local;
        local_94 = logarithmic_zero_epsilon;
        if (local_8c < 0.0) {
          local_94 = -logarithmic_zero_epsilon;
        }
        local_a0 = (double)local_94;
      }
      _zero_point_center = local_a0;
      local_a4 = (float)v_max_local;
      if (((local_a4 != 0.0) || (NAN(local_a4))) ||
         (local_ac = (float)_logarithmic_zero_epsilon_local, 0.0 <= local_ac)) {
        local_b4 = (float)_logarithmic_zero_epsilon_local;
        if (((local_b4 == 0.0) && (!NAN(local_b4))) &&
           (local_bc = (float)v_max_local, local_bc < 0.0)) {
          _zero_point_center = (double)-logarithmic_zero_epsilon;
        }
      }
      else {
        v_max_fudged = (double)-logarithmic_zero_epsilon;
      }
      uVar15 = (undefined4)(local_70 >> 0x20);
      auVar14._8_4_ = uVar15;
      auVar14._0_8_ = local_70;
      auVar14._12_4_ = 0x45300000;
      uVar13 = (undefined4)local_70;
      if (v_max_fudged <
          (auVar14._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) {
        auVar8._8_4_ = uVar15;
        auVar8._0_8_ = local_70;
        auVar8._12_4_ = 0x45300000;
        if ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0) < _zero_point_center) {
          local_c4 = (float)(v_max_local * _logarithmic_zero_epsilon_local);
          if (0.0 <= local_c4) {
            local_108 = (float)v_max_local;
            if ((local_108 < 0.0) ||
               (local_110 = (float)_logarithmic_zero_epsilon_local, local_110 < 0.0)) {
              auVar11._8_4_ = uVar15;
              auVar11._0_8_ = local_70;
              auVar11._12_4_ = 0x45300000;
              dVar2 = ImLog(-((auVar11._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) /
                            -_zero_point_center);
              dVar3 = ImLog(-v_max_fudged / -_zero_point_center);
              zero_point_snap_L = 1.0 - (float)(dVar2 / dVar3);
            }
            else {
              auVar12._8_4_ = uVar15;
              auVar12._0_8_ = local_70;
              auVar12._12_4_ = 0x45300000;
              dVar2 = ImLog(((auVar12._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) /
                            v_max_fudged);
              dVar3 = ImLog(_zero_point_center / v_max_fudged);
              zero_point_snap_L = (float)(dVar2 / dVar3);
            }
          }
          else {
            local_cc = (float)v_max_local;
            local_d4 = (float)_logarithmic_zero_epsilon_local;
            zero_point_snap_L = -local_cc / (local_d4 - local_cc);
            local_e4 = (float)v_min_local;
            if ((local_e4 != 0.0) || (NAN(local_e4))) {
              local_ec = (float)v_min_local;
              if (0.0 <= local_ec) {
                auVar10._8_4_ = uVar15;
                auVar10._0_8_ = local_70;
                auVar10._12_4_ = 0x45300000;
                dVar2 = ImLog(((auVar10._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) /
                              (double)logarithmic_zero_epsilon);
                dVar3 = ImLog(_zero_point_center / (double)logarithmic_zero_epsilon);
                zero_point_snap_L =
                     (float)(dVar2 / dVar3) * (1.0 - (zero_point_snap_L + zero_deadzone_halfsize)) +
                     zero_point_snap_L + zero_deadzone_halfsize;
              }
              else {
                auVar9._8_4_ = uVar15;
                auVar9._0_8_ = local_70;
                auVar9._12_4_ = 0x45300000;
                dVar2 = ImLog(-((auVar9._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) /
                              (double)logarithmic_zero_epsilon);
                dVar3 = ImLog(-v_max_fudged / (double)logarithmic_zero_epsilon);
                zero_point_snap_L =
                     (1.0 - (float)(dVar2 / dVar3)) * (zero_point_snap_L - zero_deadzone_halfsize);
              }
            }
          }
        }
        else {
          zero_point_snap_L = 1.0;
        }
      }
      else {
        zero_point_snap_L = 0.0;
      }
      if (bVar1) {
        local_12c = 1.0 - zero_point_snap_L;
      }
      else {
        local_12c = zero_point_snap_L;
      }
      v_local._4_4_ = local_12c;
    }
    else {
      v_local._4_4_ =
           (float)((double)(long)(local_70 - v_max_local) /
                  (double)(long)(_logarithmic_zero_epsilon_local - v_max_local));
    }
  }
  return v_local._4_4_;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}